

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml_reporter.c
# Opt level: O3

void xml_show_incomplete(TestReporter *reporter,char *filename,int line,char *message,
                        __va_list_tag *arguments)

{
  undefined8 uVar1;
  xmlChar *pxVar2;
  xmlNodePtr node;
  
  uVar1 = xmlNewChild(*(undefined8 *)(&DAT_00117f68 + (long)context_stack_p * 0x28),0,"error",0);
  xmlNewProp(uVar1,"type","Fatal");
  if (message == (char *)0x0) {
    xmlNewProp(uVar1,"message",
               "Test terminated unexpectedly, likely from a non-standard exception or Posix signal")
    ;
  }
  else {
    pxVar2 = xml_secure_vprint(message,arguments);
    xmlNewProp(uVar1,"message",pxVar2);
    (*_xmlFree)(pxVar2);
  }
  node = (xmlNodePtr)xmlNewChild(uVar1,0,"location",0);
  pxVar2 = xmlEscapePropValue(filename);
  xmlNewProp(node,"file",pxVar2);
  (*_xmlFree)(pxVar2);
  xmlFormatProp(node,(xmlChar *)"line","%d",(ulong)(uint)line);
  return;
}

Assistant:

static void xml_show_incomplete(TestReporter *reporter, const char *filename,
                                int line, const char *message, va_list arguments) {
    (void)reporter;

    struct xml_suite_context *ctx = &context_stack[context_stack_p-1];

    xmlNodePtr errNode = xmlNewChild(ctx->curTest, NULL, XMLSTRING("error"), NULL);
    xmlNewProp(errNode, XMLSTRING("type"), XMLSTRING("Fatal"));
    if (message) {
        xmlChar *xml_msg = xml_secure_vprint(message, arguments);
        xmlNewProp(errNode, XMLSTRING("message"), xml_msg);
        xmlFree(xml_msg);
    } else {
        xmlNewProp(errNode, XMLSTRING("message"),
                   XMLSTRING("Test terminated unexpectedly, likely from a non-standard exception or Posix signal"));
    }
    xmlNodePtr locNode = xmlNewChild(errNode, NULL, XMLSTRING("location"), NULL);
    xmlChar *xml_filename = xmlEscapePropValue(filename);
    xmlNewProp(locNode, XMLSTRING("file"), xml_filename);
    xmlFree(xml_filename);
    xmlFormatProp(locNode, XMLSTRING("line"), "%d", line);
}